

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O1

WaiterList * __thiscall Js::SharedArrayBuffer::GetWaiterList(SharedArrayBuffer *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  HeapAllocator *pHVar3;
  IndexToWaitersMap *pIVar4;
  WaiterList *pWVar5;
  undefined4 *puVar6;
  undefined1 local_58 [8];
  TrackAllocData data;
  WaiterList *waiters;
  uint index_local;
  
  waiters._4_4_ = index;
  if (this->sharedContents == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x17d,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    pWVar5 = (WaiterList *)0x0;
  }
  else {
    CCLock::Enter((CCLock *)&csSharedArrayBuffer);
    if (this->sharedContents->indexToWaiterList == (IndexToWaitersMap *)0x0) {
      local_58 = (undefined1  [8])
                 &JsUtil::
                  BaseDictionary<unsigned_int,Js::WaiterList*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_8e316d4;
      data.filename._0_4_ = 0x171;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
      pIVar4 = (IndexToWaitersMap *)new<Memory::HeapAllocator>(0x38,pHVar3,0x300d4a);
      pIVar4->buckets = (Type)0x0;
      pIVar4->entries = (Type)0x0;
      pIVar4->alloc = &Memory::HeapAllocator::Instance;
      pIVar4->size = 0;
      pIVar4->bucketCount = 0;
      pIVar4->count = 0;
      pIVar4->freeCount = 0;
      pIVar4->modFunctionIndex = 0x4b;
      pIVar4->stats = (Type)0x0;
      this->sharedContents->indexToWaiterList = pIVar4;
    }
    data.line = 0;
    data._36_4_ = 0;
    bVar2 = JsUtil::
            BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>
                      (this->sharedContents->indexToWaiterList,(uint *)((long)&waiters + 4),
                       (WaiterList **)&data.line);
    if (!bVar2) {
      local_58 = (undefined1  [8])&WaiterList::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_8e316d4;
      data.filename._0_4_ = 0x177;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
      pWVar5 = (WaiterList *)new<Memory::HeapAllocator>(0x48,pHVar3,0x300d4a);
      WaiterList::WaiterList(pWVar5);
      data._32_8_ = pWVar5;
      JsUtil::
      BaseDictionary<unsigned_int,Js::WaiterList*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Js::WaiterList*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<unsigned_int,Js::WaiterList*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->sharedContents->indexToWaiterList,(uint *)((long)&waiters + 4),
                 (WaiterList **)&data.line);
    }
    pWVar5 = (WaiterList *)data._32_8_;
    CCLock::Leave((CCLock *)&csSharedArrayBuffer);
  }
  return pWVar5;
}

Assistant:

WaiterList *SharedArrayBuffer::GetWaiterList(uint index)
    {
        if (sharedContents != nullptr)
        {
            // REVIEW: only lock creating the map and pass the lock to the map?
            //         use one lock per instance?
            AutoCriticalSection autoCS(&csSharedArrayBuffer);

            if (sharedContents->indexToWaiterList == nullptr)
            {
                sharedContents->indexToWaiterList = HeapNew(IndexToWaitersMap, &HeapAllocator::Instance);
            }

            WaiterList * waiters = nullptr;
            if (!sharedContents->indexToWaiterList->TryGetValue(index, &waiters))
            {
                waiters = HeapNew(WaiterList);
                sharedContents->indexToWaiterList->Add(index, waiters);
            }
            return waiters;
        }

        Assert(false);
        return nullptr;
    }